

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::createUserOpNoOut
          (PcodeCompile *this,UserOpSymbol *sym,
          vector<ExprTree_*,_std::allocator<ExprTree_*>_> *param)

{
  OpTpl *this_00;
  VarnodeTpl *this_01;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar1;
  ConstTpl CStack_88;
  ConstTpl local_68;
  ConstTpl local_48;
  
  this_00 = (OpTpl *)operator_new(0x28);
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->opc = CPUI_CALLOTHER;
  this_00->output = (VarnodeTpl *)0x0;
  this_01 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_48,this->constantspace);
  ConstTpl::ConstTpl(&local_68,real,(ulong)sym->index);
  ConstTpl::ConstTpl(&CStack_88,real,4);
  VarnodeTpl::VarnodeTpl(this_01,&local_48,&local_68,&CStack_88);
  OpTpl::addInput(this_00,this_01);
  pvVar1 = ExprTree::appendParams(this_00,param);
  return pvVar1;
}

Assistant:

vector<OpTpl *> *PcodeCompile::createUserOpNoOut(UserOpSymbol *sym,vector<ExprTree *> *param)

{
  OpTpl *op = new OpTpl(CPUI_CALLOTHER);
  VarnodeTpl *vn = new VarnodeTpl(ConstTpl(constantspace),
				    ConstTpl(ConstTpl::real,sym->getIndex()),
				    ConstTpl(ConstTpl::real,4));
  op->addInput(vn);
  return ExprTree::appendParams(op,param);
}